

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_TryEmplaceWithBadHint_Test::~Btree_TryEmplaceWithBadHint_Test
          (Btree_TryEmplaceWithBadHint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, TryEmplaceWithBadHint) {
        phmap::btree_map<int, int> m = {{1, 1}, {9, 9}};

        // Bad hint (too small), should still emplace:
        auto it = m.try_emplace(m.begin(), 2, 2);
        EXPECT_EQ(it, ++m.begin());
        EXPECT_THAT(m, ElementsAreArray(
                        std::vector<std::pair<int, int>>{{1, 1}, {2, 2}, {9, 9}}));

        // Bad hint, too large this time:
        it = m.try_emplace(++(++m.begin()), 0, 0);
        EXPECT_EQ(it, m.begin());
        EXPECT_THAT(m, ElementsAreArray(std::vector<std::pair<int, int>>{
                    {0, 0}, {1, 1}, {2, 2}, {9, 9}}));
    }